

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::FastGeneralizationsIterator<Kernel::Literal*>
          (FastGeneralizationsIterator *this,
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
  GenMatcher<Kernel::Literal*>(&this->_subst,query,parent->_nextVar);
  (this->_ldIterator)._core = (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0;
  (this->_resultNormalizer)._data._timestamp = 1;
  (this->_resultNormalizer)._data._size = 0;
  (this->_resultNormalizer)._data._deleted = 0;
  (this->_resultNormalizer)._data._capacityIndex = 0;
  (this->_resultNormalizer)._data._capacity = 0;
  *(undefined8 *)&(this->_resultNormalizer)._data._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_resultNormalizer)._data._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_resultNormalizer)._data._afterLast + 4) = 0;
  (this->_resultNormalizer)._identity = true;
  (this->_alternatives)._capacity = 0;
  (this->_alternatives)._stack = (void **)0x0;
  (this->_alternatives)._cursor = (void **)0x0;
  (this->_alternatives)._end = (void **)0x0;
  (this->_specVarNumbers)._capacity = 0;
  (this->_specVarNumbers)._stack = (uint *)0x0;
  (this->_specVarNumbers)._cursor = (uint *)0x0;
  (this->_specVarNumbers)._end = (uint *)0x0;
  (this->_nodeTypes)._capacity = 0;
  (this->_nodeTypes)._stack = (NodeAlgorithm *)0x0;
  (this->_nodeTypes)._cursor = (NodeAlgorithm *)0x0;
  (this->_nodeTypes)._end = (NodeAlgorithm *)0x0;
  init<Kernel::Literal*>(this,parent,root,query,retrieveSubstitution,reversed);
  return;
}

Assistant:

FastGeneralizationsIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      : _subst(query, parent->_nextVar)
      { init(parent, root, query, retrieveSubstitution, reversed); }